

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrIfExpr(BinaryReaderInterp *this,Index depth)

{
  bool bVar1;
  Result result;
  Offset fixup_offset;
  Offset fixup;
  Var local_70;
  Enum local_28;
  Index local_24;
  Index local_20;
  Index keep_count;
  Index drop_count;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  keep_count = depth;
  _drop_count = this;
  Location::Location((Location *)&fixup);
  Var::Var(&local_70,depth,(Location *)&fixup);
  local_28 = (Enum)SharedValidator::OnBrIf
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70);
  bVar1 = Failed((Result)local_28);
  Var::~Var(&local_70);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    result = GetBrDropKeepCount(this,keep_count,&local_20,&local_24);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::Emit(this->istream_,InterpBrUnless);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      EmitBr(this,keep_count,local_20,local_24);
      Istream::ResolveFixupU32(this->istream_,fixup_offset);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrIfExpr(Index depth) {
  Index drop_count, keep_count;
  CHECK_RESULT(validator_.OnBrIf(loc, Var(depth)));
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  // Flip the br_if so if <cond> is true it can drop values from the stack.
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  EmitBr(depth, drop_count, keep_count);
  istream_.ResolveFixupU32(fixup);
  return Result::Ok;
}